

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O3

CSHA256 * __thiscall CSHA256::Write(CSHA256 *this,uchar *data,size_t len)

{
  uchar *puVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = data + len;
  uVar3 = this->bytes & 0x3f;
  if (uVar3 != 0) {
    if (len + uVar3 < 0x40) goto LAB_00186e31;
    sVar5 = 0x40 - uVar3;
    memcpy(this->buf + uVar3,data,sVar5);
    this->bytes = this->bytes + sVar5;
    data = data + sVar5;
    (*(code *)(anonymous_namespace)::Transform)(this,this->buf,1);
  }
  uVar3 = 0;
LAB_00186e31:
  uVar4 = (long)puVar1 - (long)data;
  if (0x3f < (long)uVar4) {
    (*(code *)(anonymous_namespace)::Transform)(this,data,uVar4 >> 6);
    data = data + (uVar4 & 0x7fffffffffffffc0);
    this->bytes = this->bytes + (uVar4 & 0x7fffffffffffffc0);
  }
  sVar5 = (long)puVar1 - (long)data;
  if (data <= puVar1 && sVar5 != 0) {
    memcpy(this->buf + uVar3,data,sVar5);
    this->bytes = this->bytes + sVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CSHA256& CSHA256::Write(const unsigned char* data, size_t len)
{
    const unsigned char* end = data + len;
    size_t bufsize = bytes % 64;
    if (bufsize && bufsize + len >= 64) {
        // Fill the buffer, and process it.
        memcpy(buf + bufsize, data, 64 - bufsize);
        bytes += 64 - bufsize;
        data += 64 - bufsize;
        Transform(s, buf, 1);
        bufsize = 0;
    }
    if (end - data >= 64) {
        size_t blocks = (end - data) / 64;
        Transform(s, data, blocks);
        data += 64 * blocks;
        bytes += 64 * blocks;
    }
    if (end > data) {
        // Fill the buffer with what remains.
        memcpy(buf + bufsize, data, end - data);
        bytes += end - data;
    }
    return *this;
}